

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O1

bool __thiscall
FIX::MessageStoreExceptionWrapper::set
          (MessageStoreExceptionWrapper *this,int num,string *msg,bool *threw,IOException *ex)

{
  undefined1 uVar1;
  
  *threw = false;
  uVar1 = (**(code **)(**(long **)this + 0x10))();
  return (bool)uVar1;
}

Assistant:

bool MessageStoreExceptionWrapper::set( int num, const std::string& msg, bool& threw, IOException& ex )
{
  threw = false;
  try { return m_pStore->set( num, msg ); }
  catch ( IOException & e ) { threw = true; ex = e; return false; }
}